

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

lua_CFunction lua_tocfunction(lua_State *L,int idx)

{
  TValue *pTVar1;
  lua_CFunction p_Var2;
  
  pTVar1 = index2adr(L,idx);
  if (((pTVar1->field_2).it == 0xfffffff7) &&
     (0xfffffffd < *(byte *)(ulong)*(uint *)((ulong)(pTVar1->u32).lo + 0x10) - 0x61)) {
    p_Var2 = *(lua_CFunction *)((ulong)(pTVar1->u32).lo + 0x18);
  }
  else {
    p_Var2 = (lua_CFunction)0x0;
  }
  return p_Var2;
}

Assistant:

LUA_API lua_CFunction lua_tocfunction(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisfunc(o)) {
    BCOp op = bc_op(*mref(funcV(o)->c.pc, BCIns));
    if (op == BC_FUNCC || op == BC_FUNCCW)
      return funcV(o)->c.f;
  }
  return NULL;
}